

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_sps.c
# Opt level: O1

MPP_RET h264e_sps_update(H264eSps *sps,MppEncCfgSet *cfg)

{
  MppFrameFormat MVar1;
  uint v;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  MppFrameColorPrimaries MVar5;
  MppFrameColorTransferCharacteristic MVar6;
  MppFrameColorSpace MVar7;
  RK_S32 RVar8;
  int iVar9;
  MppEncCpbInfo *pMVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  
  pMVar10 = mpp_enc_ref_cfg_get_cpb_info(cfg->ref_cfg);
  MVar1 = (cfg->prep).format;
  v = (cfg->rc).gop;
  uVar2 = (cfg->prep).width;
  uVar3 = (cfg->prep).height;
  iVar9 = (cfg->codec).field_1.h264.level;
  iVar13 = (cfg->codec).field_1.h264.profile;
  sps->profile_idc = iVar13;
  if (iVar13 < 0x6e) {
    if (iVar13 == 0x42) {
      sps->constraint_set0 = 1;
      sps->constraint_set1 = 1;
    }
    else {
      if (iVar13 != 0x4d) goto LAB_00237fe5;
      sps->constraint_set0 = 0;
      sps->constraint_set1 = 1;
    }
    sps->constraint_set2 = 0;
    sps->constraint_set3 = 0;
    sps->constraint_set4 = 0;
    sps->constraint_set5 = 0;
  }
  else {
LAB_00237fe5:
    sps->constraint_set0 = 0;
    sps->constraint_set1 = 0;
    sps->constraint_set2 = 0;
    sps->constraint_set3 = 0;
    sps->constraint_set4 = 0;
    sps->constraint_set5 = 0;
  }
  uVar4 = (cfg->codec).field_1.h264.constraint_set;
  if ((uVar4 >> 0x10 & 1) != 0) {
    sps->constraint_set0 = uVar4 & 1;
  }
  if ((uVar4 >> 0x11 & 1) != 0) {
    sps->constraint_set1 = uVar4 >> 1 & 1;
  }
  if ((uVar4 >> 0x12 & 1) != 0) {
    sps->constraint_set2 = uVar4 >> 2 & 1;
  }
  if ((uVar4 >> 0x13 & 1) != 0) {
    sps->constraint_set3 = uVar4 >> 3 & 1;
  }
  if ((uVar4 >> 0x14 & 1) != 0) {
    sps->constraint_set4 = uVar4 >> 4 & 1;
  }
  uVar15 = uVar2 + 0xf & 0xfffffff0;
  uVar14 = uVar3 + 0xf & 0xfffffff0;
  if ((uVar4 >> 0x15 & 1) != 0) {
    sps->constraint_set5 = uVar4 >> 5 & 1;
  }
  lVar12 = 0;
  do {
    if ((int)(uVar14 * uVar15) >> 8 <= *(int *)((long)&level_infos[0].max_MBs + lVar12)) {
      iVar13 = *(int *)((long)&level_infos[0].level + lVar12);
      if ((iVar13 != 99 && iVar9 < iVar13) && (iVar9 = iVar13, ((byte)h264e_debug & 0x10) != 0)) {
        _mpp_log_l(4,"h264e_sps","set level to %s\n","h264e_sps_update",
                   *(undefined8 *)((long)&level_infos[0].name + lVar12));
      }
      break;
    }
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0x280);
  sps->level_idc = iVar9;
  sps->sps_id = 0;
  sps->chroma_format_idc = (uint)(MVar1 != MPP_FMT_YUV400);
  sps->pic_order_cnt_type = (cfg->codec).field_1.h264.hw_cfg.hw_poc_type;
  sps->log2_max_poc_lsb_minus4 = (cfg->codec).field_1.h264.log2_max_poc_lsb;
  sps->log2_max_frame_num_minus4 = (cfg->codec).field_1.h264.log2_max_frame_num;
  if (((int)v < 0) &&
     (_mpp_log_l(2,"h264e_sps","Assertion %s failed at %s:%d\n",(char *)0x0,"gop >= 0",
                 "h264e_sps_update",0xa9), (mpp_debug._3_1_ & 0x10) != 0)) {
    abort();
  }
  if (v < 2) {
    sps->log2_max_frame_num_minus4 = 0xc;
    iVar11 = 0xc;
  }
  else {
    RVar8 = mpp_log2(v);
    iVar9 = 0x10;
    if (RVar8 < 0x11) {
      iVar9 = mpp_log2(v);
    }
    iVar13 = iVar9 + -4;
    if (iVar9 < 5) {
      iVar13 = 0;
    }
    iVar11 = 0xf;
    if (iVar9 < 0xf) {
      iVar11 = iVar9;
    }
    iVar11 = iVar11 + -3;
    if (sps->log2_max_frame_num_minus4 < iVar13) {
      sps->log2_max_frame_num_minus4 = iVar13;
    }
    if (iVar9 < 4) {
      iVar11 = 0;
    }
    if (iVar11 <= sps->log2_max_poc_lsb_minus4) goto LAB_00238238;
  }
  sps->log2_max_poc_lsb_minus4 = iVar11;
LAB_00238238:
  sps->num_ref_frames = pMVar10->dpb_size;
  sps->gaps_in_frame_num_value_allowed = (uint)((cfg->codec).field_1.h264.gaps_not_allowed == 0);
  sps->pic_width_in_mbs = (int)(uVar2 + 0xf) >> 4;
  sps->pic_height_in_mbs = (int)(uVar3 + 0xf) >> 4;
  sps->frame_mbs_only = 1;
  sps->direct8x8_inference = (cfg->codec).field_1.h264.transform8x8_mode;
  if (uVar14 == uVar3 && uVar15 == uVar2) {
    sps->cropping = 0;
    (sps->crop).left = 0;
    (sps->crop).right = 0;
    (sps->crop).top = 0;
    (sps->crop).bottom = 0;
  }
  else {
    sps->cropping = 1;
    (sps->crop).left = 0;
    (sps->crop).right = uVar15 - uVar2;
    (sps->crop).top = 0;
    (sps->crop).bottom = uVar14 - uVar3;
  }
  memset(&sps->vui,0,0xb0);
  (sps->vui).vui_present = 1;
  (sps->vui).timing_info_present = 1;
  (sps->vui).time_scale = (cfg->rc).fps_out_num * 2;
  (sps->vui).num_units_in_tick = (cfg->rc).fps_out_denom;
  (sps->vui).fixed_frame_rate = (uint)((cfg->rc).fps_out_flex == 0);
  (sps->vui).vidformat = 5;
  if ((cfg->prep).range == MPP_FRAME_RANGE_JPEG) {
    (sps->vui).signal_type_present = 1;
    (sps->vui).fullrange = 1;
  }
  MVar5 = (cfg->prep).colorprim;
  if (((MVar5 < MPP_FRAME_PRI_NB && MVar5 != MPP_FRAME_PRI_UNSPECIFIED) ||
      (MVar6 = (cfg->prep).colortrc, MVar6 < MPP_FRAME_TRC_NB && MVar6 != MPP_FRAME_TRC_UNSPECIFIED)
      ) || (MVar7 = (cfg->prep).color,
           MVar7 != MPP_FRAME_SPC_UNSPECIFIED && MVar7 < MPP_FRAME_SPC_NB)) {
    (sps->vui).signal_type_present = 1;
    (sps->vui).color_description_present = 1;
    (sps->vui).colorprim = MVar5;
    (sps->vui).colortrc = (cfg->prep).colortrc;
    (sps->vui).colmatrix = (cfg->prep).color;
  }
  (sps->vui).bitstream_restriction = 1;
  (sps->vui).motion_vectors_over_pic_boundaries = 1;
  (sps->vui).log2_max_mv_length_horizontal = 0xf;
  (sps->vui).log2_max_mv_length_vertical = 0xf;
  (sps->vui).max_dec_frame_buffering = pMVar10->dpb_size;
  return MPP_OK;
}

Assistant:

MPP_RET h264e_sps_update(H264eSps *sps, MppEncCfgSet *cfg)
{
    H264eVui *vui = &sps->vui;
    MppEncPrepCfg *prep = &cfg->prep;
    MppEncRcCfg *rc = &cfg->rc;
    MppEncH264Cfg *h264 = &cfg->codec.h264;
    MppEncRefCfg ref = cfg->ref_cfg;
    MppEncCpbInfo *info = mpp_enc_ref_cfg_get_cpb_info(ref);
    MppFrameFormat fmt = prep->format;
    RK_S32 gop = rc->gop;
    RK_S32 width = prep->width;
    RK_S32 height = prep->height;
    RK_S32 aligned_w = MPP_ALIGN(width, 16);
    RK_S32 aligned_h = MPP_ALIGN(height, 16);
    RK_S32 crop_right = MPP_ALIGN(width, 16) - width;
    RK_S32 crop_bottom = MPP_ALIGN(height, 16) - height;
    /* default 720p */
    H264Level level_idc = h264->level;

    // default sps
    // profile baseline
    sps->profile_idc = h264->profile;
    switch (sps->profile_idc) {
    case H264_PROFILE_BASELINE : {
        sps->constraint_set0 = 1;
        sps->constraint_set1 = 1;
        sps->constraint_set2 = 0;
        sps->constraint_set3 = 0;
        sps->constraint_set4 = 0;
        sps->constraint_set5 = 0;
    } break;
    case H264_PROFILE_MAIN : {
        sps->constraint_set0 = 0;
        sps->constraint_set1 = 1;
        sps->constraint_set2 = 0;
        sps->constraint_set3 = 0;
        sps->constraint_set4 = 0;
        sps->constraint_set5 = 0;
    } break;
    case H264_PROFILE_HIGH :
    case H264_PROFILE_HIGH10 :
    case H264_PROFILE_HIGH422 :
    case H264_PROFILE_HIGH444 : {
        sps->constraint_set0 = 0;
        sps->constraint_set1 = 0;
        sps->constraint_set2 = 0;
        sps->constraint_set3 = 0;
        sps->constraint_set4 = 0;
        sps->constraint_set5 = 0;
    } break;
    default : {
        sps->constraint_set0 = 0;
        sps->constraint_set1 = 0;
        sps->constraint_set2 = 0;
        sps->constraint_set3 = 0;
        sps->constraint_set4 = 0;
        sps->constraint_set5 = 0;
    } break;
    }

    //updata constraint_set0~5
    RK_U32 set = h264->constraint_set;
    RK_U8 constraint_force = (set >> 0) & 0x3f;
    RK_U8 force_flag = (set >> 16) & 0x3f;

    if (force_flag & 1)
        sps->constraint_set0 = (constraint_force & 1) ? 1 : 0;
    if (force_flag & 2)
        sps->constraint_set1 = (constraint_force & 2) ? 1 : 0;
    if (force_flag & 4)
        sps->constraint_set2 = (constraint_force & 4) ? 1 : 0;
    if (force_flag & 8)
        sps->constraint_set3 = (constraint_force & 8) ? 1 : 0;
    if (force_flag & 16)
        sps->constraint_set4 = (constraint_force & 16) ? 1 : 0;
    if (force_flag & 32)
        sps->constraint_set5 = (constraint_force & 32) ? 1 : 0;

    // level_idc is connected with frame size
    {
        RK_S32 mbs = (aligned_w * aligned_h) >> 8;
        RK_S32 i;
        RK_S32 min_level = 10;

        for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(level_infos); i++) {
            if (level_infos[i].max_MBs >= mbs) {
                min_level = level_infos[i].level;

                if (min_level > (RK_S32)level_idc &&
                    min_level != H264_LEVEL_1_b) {
                    level_idc = min_level;
                    h264e_dbg_sps("set level to %s\n", level_infos[i].name);
                }

                break;
            }
        }
    }
    sps->level_idc = level_idc;

    sps->sps_id = 0;
    sps->chroma_format_idc = (fmt == MPP_FMT_YUV400) ? H264_CHROMA_400 : H264_CHROMA_420;

    // set max frame number and poc lsb according to gop size
    sps->pic_order_cnt_type = h264->hw_cfg.hw_poc_type;
    sps->log2_max_poc_lsb_minus4 = h264->log2_max_poc_lsb;
    sps->log2_max_frame_num_minus4 = h264->log2_max_frame_num;

    mpp_assert(gop >= 0);
    if (gop == 0) {
        // only one I then all P frame
        sps->log2_max_frame_num_minus4 = 12;
        sps->log2_max_poc_lsb_minus4 = 12;
    } else if (gop == 1) {
        // all I frame
        sps->log2_max_frame_num_minus4 = 12;
        sps->log2_max_poc_lsb_minus4 = 12;
    } else {
        // normal case
        RK_S32 log2_gop = MPP_MIN(mpp_log2(gop), 16);
        RK_S32 log2_frm_num = (log2_gop <= 4) ? (0) : (log2_gop - 4);
        RK_S32 log2_poc_lsb = (log2_gop <= 3) ? (0) : (log2_gop - 3);

        if (sps->log2_max_frame_num_minus4 < log2_frm_num)
            sps->log2_max_frame_num_minus4 = log2_frm_num;

        if (log2_poc_lsb > 12)
            log2_poc_lsb = 12;

        if (sps->log2_max_poc_lsb_minus4 < log2_poc_lsb)
            sps->log2_max_poc_lsb_minus4 = log2_poc_lsb;
    }

    // max one reference frame
    sps->num_ref_frames = info->dpb_size;

    sps->gaps_in_frame_num_value_allowed = !h264->gaps_not_allowed;

    // default 720p without cropping
    sps->pic_width_in_mbs = aligned_w >> 4;
    sps->pic_height_in_mbs = aligned_h >> 4;
    sps->frame_mbs_only = 1;

    // baseline disable 8x8
    sps->direct8x8_inference = h264->transform8x8_mode;
    if (crop_right || crop_bottom) {
        sps->cropping = 1;
        sps->crop.left = 0;
        sps->crop.right = crop_right;
        sps->crop.top = 0;
        sps->crop.bottom = crop_bottom;
    } else {
        sps->cropping = 0;
        memset(&sps->crop, 0, sizeof(sps->crop));
    }

    memset(vui, 0, sizeof(*vui));
    vui->vui_present = 1;
    vui->timing_info_present = 1;
    vui->time_scale = rc->fps_out_num * 2;
    vui->num_units_in_tick = rc->fps_out_denom;
    vui->fixed_frame_rate = !rc->fps_out_flex;
    vui->vidformat = MPP_FRAME_VIDEO_FMT_UNSPECIFIED;

    if (prep->range == MPP_FRAME_RANGE_JPEG) {
        vui->signal_type_present = 1;
        vui->fullrange = 1;
    }

    if ((prep->colorprim <= MPP_FRAME_PRI_JEDEC_P22 &&
         prep->colorprim != MPP_FRAME_PRI_UNSPECIFIED) ||
        (prep->colortrc <= MPP_FRAME_TRC_ARIB_STD_B67 &&
         prep->colortrc != MPP_FRAME_TRC_UNSPECIFIED) ||
        (prep->color <= MPP_FRAME_SPC_ICTCP &&
         prep->color != MPP_FRAME_SPC_UNSPECIFIED)) {
        vui->signal_type_present = 1;
        vui->color_description_present = 1;
        vui->colorprim = prep->colorprim;
        vui->colortrc = prep->colortrc;
        vui->colmatrix = prep->color;
    }

    vui->bitstream_restriction = 1;
    vui->motion_vectors_over_pic_boundaries = 1;
    /* the max and default value has been changed to 15 since the 2016 standard */
    vui->log2_max_mv_length_horizontal = 15;
    vui->log2_max_mv_length_vertical = 15;
    vui->max_dec_frame_buffering = info->dpb_size;

    return MPP_OK;
}